

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_miniz.cpp
# Opt level: O2

mz_bool tdefl_compress_block(tdefl_compressor *d,mz_bool static_block)

{
  mz_uint16 (*pamVar1) [288];
  mz_uint16 *pmVar2;
  mz_uint16 *pmVar3;
  byte bVar4;
  ushort uVar5;
  byte *pbVar6;
  uint uVar7;
  byte *pbVar8;
  mz_uint8 (*pamVar9) [288];
  mz_uint16 (*pamVar10) [288];
  uint uVar11;
  long lVar12;
  undefined1 *puVar13;
  mz_uint16 *pmVar14;
  byte *pbVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  long lVar22;
  ulong *puVar23;
  ulong uVar24;
  mz_uint mVar25;
  ulong uVar26;
  ulong uVar27;
  char cVar28;
  ulong uVar30;
  char cVar31;
  byte bVar32;
  mz_uint8 *pmVar33;
  mz_uint8 *pmVar34;
  ulong uVar35;
  bool bVar36;
  byte abStack_2b8 [320];
  mz_uint8 code_sizes_to_pack [320];
  short sVar29;
  
  if (static_block == 0) {
    d->m_huff_count[0][0x100] = 1;
    tdefl_optimize_huffman_table(d,0,0x120,0xf,0);
    tdefl_optimize_huffman_table(d,1,0x20,0xf,0);
    iVar16 = 0x11f;
    lVar12 = 0x9067;
    do {
      if (lVar12 - 0x8f49U < 0x102) {
        iVar16 = 0x101;
        break;
      }
      iVar16 = iVar16 + -1;
      lVar22 = lVar12 + -0x14;
      lVar12 = lVar12 + -1;
    } while (*(char *)((long)d->m_max_probes + lVar22) == '\0');
    lVar12 = 36999;
    iVar17 = 0x1f;
    do {
      iVar20 = 1;
      if (lVar12 - 0x9069U < 2) break;
      iVar20 = iVar17 + -1;
      lVar22 = lVar12 + -0x14;
      lVar12 = lVar12 + -1;
      iVar17 = iVar20;
    } while (*(char *)((long)d->m_max_probes + lVar22) == '\0');
    memcpy(code_sizes_to_pack,d->m_huff_code_sizes,(long)iVar16);
    memcpy(code_sizes_to_pack + iVar16,d->m_huff_code_sizes + 1,(long)iVar20);
    pamVar1 = d->m_huff_count + 2;
    pamVar10 = d->m_huff_count;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 0x10) = 0;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 0x12) = 0;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 0x14) = 0;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 0x16) = 0;
    pamVar10 = d->m_huff_count;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 0x18) = 0;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 0x1a) = 0;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 0x1c) = 0;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 0x1e) = 0;
    pamVar10 = d->m_huff_count;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 0x1e) = 0;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 0x20) = 0;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 0x22) = 0;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 0x24) = 0;
    *(mz_uint16 *)((long)(d->m_huff_count + 2) + 0) = 0;
    *(mz_uint16 *)((long)(d->m_huff_count + 2) + 2) = 0;
    *(mz_uint16 *)((long)(d->m_huff_count + 2) + 4) = 0;
    *(mz_uint16 *)((long)(d->m_huff_count + 2) + 6) = 0;
    pamVar10 = d->m_huff_count;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 8) = 0;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 10) = 0;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 0xc) = 0;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 0xe) = 0;
    pmVar2 = d->m_huff_count[2] + 0x12;
    pmVar3 = d->m_huff_count[2] + 0x11;
    uVar24 = 0;
    uVar11 = 0;
    uVar21 = 0;
    uVar30 = 0;
    uVar27 = 0xff;
    while( true ) {
      bVar32 = (byte)uVar27;
      uVar19 = (uint)uVar30;
      cVar31 = (char)uVar21;
      cVar28 = (char)uVar11;
      sVar29 = (short)uVar11;
      if (uVar24 == (uint)(iVar20 + iVar16)) break;
      bVar4 = code_sizes_to_pack[uVar24];
      uVar26 = (ulong)bVar4;
      if (uVar26 == 0) {
        if (uVar11 != 0) {
          if (uVar11 < 3) {
            (*pamVar1)[uVar27] = (*pamVar1)[uVar27] + sVar29;
            while (bVar36 = uVar11 != 0, uVar11 = uVar11 - 1, bVar36) {
              abStack_2b8[uVar30] = bVar32;
              uVar30 = (ulong)((int)uVar30 + 1);
            }
          }
          else {
            pmVar14 = d->m_huff_count[2] + 0x10;
            *pmVar14 = *pmVar14 + 1;
            abStack_2b8[uVar30] = 0x10;
            uVar30 = (ulong)(uVar19 + 2);
            abStack_2b8[uVar19 + 1] = cVar28 - 3;
          }
        }
        uVar21 = uVar21 + 1;
        if (uVar21 == 0x8a) {
          *pmVar2 = *pmVar2 + 1;
          iVar17 = (int)uVar30;
          abStack_2b8[uVar30] = 0x12;
          uVar30 = (ulong)(iVar17 + 2);
          abStack_2b8[iVar17 + 1] = 0x7f;
          goto LAB_0012e897;
        }
        uVar11 = 0;
      }
      else {
        uVar35 = uVar30;
        if (uVar21 != 0) {
          if (uVar21 < 3) {
            (*pamVar1)[0] = (*pamVar1)[0] + (short)uVar21;
            while (bVar36 = uVar21 != 0, uVar21 = uVar21 - 1, bVar36) {
              abStack_2b8[uVar35] = 0;
              uVar35 = (ulong)((int)uVar35 + 1);
            }
          }
          else {
            uVar35 = (ulong)(uVar19 + 2);
            bVar36 = uVar21 < 0xb;
            pmVar14 = pmVar2;
            if (bVar36) {
              pmVar14 = pmVar3;
            }
            *pmVar14 = *pmVar14 + 1;
            abStack_2b8[uVar30] = 0x12 - bVar36;
            abStack_2b8[uVar19 + 1] = (bVar36 * '\b' + cVar31) - 0xb;
          }
        }
        iVar17 = (int)uVar35;
        if (bVar4 == bVar32) {
          uVar11 = uVar11 + 1;
          uVar30 = uVar35;
          if (uVar11 == 6) {
            pmVar14 = d->m_huff_count[2] + 0x10;
            *pmVar14 = *pmVar14 + 1;
            abStack_2b8[uVar35] = 0x10;
            abStack_2b8[iVar17 + 1] = 3;
            uVar30 = (ulong)(iVar17 + 2);
            goto LAB_0012e897;
          }
        }
        else {
          if (uVar11 != 0) {
            if (uVar11 < 3) {
              (*pamVar1)[uVar27] = (*pamVar1)[uVar27] + sVar29;
              while (bVar36 = uVar11 != 0, uVar11 = uVar11 - 1, bVar36) {
                abStack_2b8[uVar35] = bVar32;
                uVar35 = (ulong)((int)uVar35 + 1);
              }
            }
            else {
              pmVar14 = d->m_huff_count[2] + 0x10;
              *pmVar14 = *pmVar14 + 1;
              abStack_2b8[uVar35] = 0x10;
              uVar35 = (ulong)(iVar17 + 2);
              abStack_2b8[iVar17 + 1] = cVar28 - 3;
            }
          }
          (*pamVar1)[uVar26] = (*pamVar1)[uVar26] + 1;
          uVar30 = (ulong)((int)uVar35 + 1);
          abStack_2b8[uVar35] = bVar4;
LAB_0012e897:
          uVar11 = 0;
        }
        uVar21 = 0;
      }
      uVar24 = uVar24 + 1;
      uVar27 = uVar26;
    }
    if (uVar11 == 0) {
      if (uVar21 != 0) {
        if (uVar21 < 3) {
          (*pamVar1)[0] = (*pamVar1)[0] + (short)uVar21;
          while( true ) {
            uVar19 = (uint)uVar30;
            bVar36 = uVar21 == 0;
            uVar21 = uVar21 - 1;
            if (bVar36) break;
            abStack_2b8[uVar30] = 0;
            uVar30 = (ulong)(uVar19 + 1);
          }
        }
        else {
          uVar11 = uVar19 + 1;
          uVar19 = uVar19 + 2;
          if (uVar21 < 0xb) {
            *pmVar3 = *pmVar3 + 1;
            abStack_2b8[uVar30] = 0x11;
            bVar32 = cVar31 - 3;
          }
          else {
            *pmVar2 = *pmVar2 + 1;
            abStack_2b8[uVar30] = 0x12;
            bVar32 = cVar31 - 0xb;
          }
          abStack_2b8[uVar11] = bVar32;
        }
      }
    }
    else if (uVar11 < 3) {
      (*pamVar1)[uVar27] = (*pamVar1)[uVar27] + sVar29;
      while( true ) {
        uVar19 = (uint)uVar30;
        bVar36 = uVar11 == 0;
        uVar11 = uVar11 - 1;
        if (bVar36) break;
        abStack_2b8[uVar30] = bVar32;
        uVar30 = (ulong)(uVar19 + 1);
      }
    }
    else {
      pmVar2 = d->m_huff_count[2] + 0x10;
      *pmVar2 = *pmVar2 + 1;
      uVar11 = uVar19 + 1;
      abStack_2b8[uVar30] = 0x10;
      uVar19 = uVar19 + 2;
      abStack_2b8[uVar11] = cVar28 - 3;
    }
    tdefl_optimize_huffman_table(d,2,0x13,7,0);
    uVar21 = 2 << ((byte)d->m_bits_in & 0x1f) | d->m_bit_buffer;
    d->m_bit_buffer = uVar21;
    for (uVar11 = d->m_bits_in + 2; d->m_bits_in = uVar11, 7 < uVar11; uVar11 = uVar11 - 8) {
      pmVar34 = d->m_pOutput_buf;
      if (pmVar34 < d->m_pOutput_buf_end) {
        d->m_pOutput_buf = pmVar34 + 1;
        *pmVar34 = (mz_uint8)uVar21;
        uVar11 = d->m_bits_in;
        uVar21 = d->m_bit_buffer;
      }
      uVar21 = uVar21 >> 8;
      d->m_bit_buffer = uVar21;
    }
    mVar25 = iVar16 + -0x101 << ((byte)uVar11 & 0x1f) | uVar21;
    d->m_bit_buffer = mVar25;
    for (uVar11 = uVar11 + 5; d->m_bits_in = uVar11, 7 < uVar11; uVar11 = uVar11 - 8) {
      pmVar34 = d->m_pOutput_buf;
      if (pmVar34 < d->m_pOutput_buf_end) {
        d->m_pOutput_buf = pmVar34 + 1;
        *pmVar34 = (mz_uint8)mVar25;
        uVar11 = d->m_bits_in;
        mVar25 = d->m_bit_buffer;
      }
      mVar25 = mVar25 >> 8;
      d->m_bit_buffer = mVar25;
    }
    mVar25 = iVar20 + -1 << ((byte)uVar11 & 0x1f) | mVar25;
    d->m_bit_buffer = mVar25;
    for (uVar11 = uVar11 + 5; d->m_bits_in = uVar11, 7 < uVar11; uVar11 = uVar11 - 8) {
      pmVar34 = d->m_pOutput_buf;
      if (pmVar34 < d->m_pOutput_buf_end) {
        d->m_pOutput_buf = pmVar34 + 1;
        *pmVar34 = (mz_uint8)mVar25;
        uVar11 = d->m_bits_in;
        mVar25 = d->m_bit_buffer;
      }
      mVar25 = mVar25 >> 8;
      d->m_bit_buffer = mVar25;
    }
    uVar21 = 0x12;
    while ((uVar18 = 0xffffffff, -1 < (int)uVar21 &&
           (uVar18 = uVar21, d->m_huff_code_sizes[2]["\x10\x11\x12"[uVar21]] == '\0'))) {
      uVar21 = uVar21 - 1;
    }
    if ((int)uVar18 < 4) {
      uVar18 = 3;
    }
    uVar18 = uVar18 - 3 << ((byte)uVar11 & 0x1f) | mVar25;
    d->m_bit_buffer = uVar18;
    for (uVar11 = uVar11 + 4; d->m_bits_in = uVar11, 7 < uVar11; uVar11 = uVar11 - 8) {
      pmVar34 = d->m_pOutput_buf;
      if (pmVar34 < d->m_pOutput_buf_end) {
        d->m_pOutput_buf = pmVar34 + 1;
        *pmVar34 = (mz_uint8)uVar18;
        uVar11 = d->m_bits_in;
        uVar18 = d->m_bit_buffer;
      }
      uVar18 = uVar18 >> 8;
      d->m_bit_buffer = uVar18;
    }
    uVar7 = 3;
    if (3 < (int)uVar21) {
      uVar7 = uVar21;
    }
    for (uVar27 = 0; uVar27 != uVar7 + 1; uVar27 = uVar27 + 1) {
      uVar18 = uVar18 | (uint)d->m_huff_code_sizes[2]["\x10\x11\x12"[uVar27]] <<
                        ((byte)uVar11 & 0x1f);
      d->m_bit_buffer = uVar18;
      for (uVar11 = uVar11 + 3; d->m_bits_in = uVar11, 7 < uVar11; uVar11 = uVar11 - 8) {
        pmVar34 = d->m_pOutput_buf;
        if (pmVar34 < d->m_pOutput_buf_end) {
          d->m_pOutput_buf = pmVar34 + 1;
          *pmVar34 = (mz_uint8)uVar18;
          uVar11 = d->m_bits_in;
          uVar18 = d->m_bit_buffer;
        }
        uVar18 = uVar18 >> 8;
        d->m_bit_buffer = uVar18;
      }
    }
    uVar27 = 0;
    while (uVar21 = (uint)uVar27, uVar21 < uVar19) {
      uVar30 = uVar27 & 0xffffffff;
      bVar32 = abStack_2b8[uVar30];
      bVar4 = d->m_huff_code_sizes[2][bVar32];
      uVar18 = uVar18 | (uint)d->m_huff_codes[2][bVar32] << ((byte)uVar11 & 0x1f);
      d->m_bit_buffer = uVar18;
      for (uVar11 = uVar11 + bVar4; d->m_bits_in = uVar11, 7 < uVar11; uVar11 = uVar11 - 8) {
        pmVar34 = d->m_pOutput_buf;
        if (pmVar34 < d->m_pOutput_buf_end) {
          d->m_pOutput_buf = pmVar34 + 1;
          *pmVar34 = (mz_uint8)uVar18;
          uVar11 = d->m_bits_in;
          uVar18 = d->m_bit_buffer;
        }
        uVar18 = uVar18 >> 8;
        d->m_bit_buffer = uVar18;
      }
      uVar27 = uVar30 + 1;
      if (0xf < bVar32) {
        cVar28 = "\x02\x03\a"[bVar32 - 0x10];
        uVar18 = uVar18 | (uint)abStack_2b8[uVar30 + 1] << ((byte)uVar11 & 0x1f);
        d->m_bit_buffer = uVar18;
        for (uVar11 = uVar11 + (int)cVar28; d->m_bits_in = uVar11, 7 < uVar11; uVar11 = uVar11 - 8)
        {
          pmVar34 = d->m_pOutput_buf;
          if (pmVar34 < d->m_pOutput_buf_end) {
            d->m_pOutput_buf = pmVar34 + 1;
            *pmVar34 = (mz_uint8)uVar18;
            uVar11 = d->m_bits_in;
            uVar18 = d->m_bit_buffer;
          }
          uVar18 = uVar18 >> 8;
          d->m_bit_buffer = uVar18;
        }
        uVar27 = (ulong)(uVar21 + 2);
      }
    }
  }
  else {
    for (lVar12 = 0x8f4a; (int)lVar12 != 0x8fda; lVar12 = lVar12 + 1) {
      *(undefined1 *)((long)d->m_max_probes + lVar12 + -0x14) = 8;
    }
    puVar13 = (undefined1 *)((long)d->m_max_probes + lVar12 + -0x14);
    for (iVar16 = 0x90; iVar16 != 0x100; iVar16 = iVar16 + 1) {
      *puVar13 = 9;
      puVar13 = puVar13 + 1;
    }
    for (lVar12 = 0; (int)lVar12 != 0x18; lVar12 = lVar12 + 1) {
      puVar13[lVar12] = 7;
    }
    for (lVar22 = 0; (int)lVar22 != 8; lVar22 = lVar22 + 1) {
      puVar13[lVar12 + lVar22] = 8;
    }
    pamVar9 = d->m_huff_code_sizes;
    *(mz_uint8 *)((long)(pamVar9 + 1) + 0x10) = '\x05';
    *(mz_uint8 *)((long)(pamVar9 + 1) + 0x11) = '\x05';
    *(mz_uint8 *)((long)(pamVar9 + 1) + 0x12) = '\x05';
    *(mz_uint8 *)((long)(pamVar9 + 1) + 0x13) = '\x05';
    *(mz_uint8 *)((long)(pamVar9 + 1) + 0x14) = '\x05';
    *(mz_uint8 *)((long)(pamVar9 + 1) + 0x15) = '\x05';
    *(mz_uint8 *)((long)(pamVar9 + 1) + 0x16) = '\x05';
    *(mz_uint8 *)((long)(pamVar9 + 1) + 0x17) = '\x05';
    pamVar9 = d->m_huff_code_sizes;
    *(mz_uint8 *)((long)(pamVar9 + 1) + 0x18) = '\x05';
    *(mz_uint8 *)((long)(pamVar9 + 1) + 0x19) = '\x05';
    *(mz_uint8 *)((long)(pamVar9 + 1) + 0x1a) = '\x05';
    *(mz_uint8 *)((long)(pamVar9 + 1) + 0x1b) = '\x05';
    *(mz_uint8 *)((long)(pamVar9 + 1) + 0x1c) = '\x05';
    *(mz_uint8 *)((long)(pamVar9 + 1) + 0x1d) = '\x05';
    *(mz_uint8 *)((long)(pamVar9 + 1) + 0x1e) = '\x05';
    *(mz_uint8 *)((long)(pamVar9 + 1) + 0x1f) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 0) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 1) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 2) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 3) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 4) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 5) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 6) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 7) = '\x05';
    pamVar9 = d->m_huff_code_sizes;
    *(mz_uint8 *)((long)(pamVar9 + 1) + 8) = '\x05';
    *(mz_uint8 *)((long)(pamVar9 + 1) + 9) = '\x05';
    *(mz_uint8 *)((long)(pamVar9 + 1) + 10) = '\x05';
    *(mz_uint8 *)((long)(pamVar9 + 1) + 0xb) = '\x05';
    *(mz_uint8 *)((long)(pamVar9 + 1) + 0xc) = '\x05';
    *(mz_uint8 *)((long)(pamVar9 + 1) + 0xd) = '\x05';
    *(mz_uint8 *)((long)(pamVar9 + 1) + 0xe) = '\x05';
    *(mz_uint8 *)((long)(pamVar9 + 1) + 0xf) = '\x05';
    tdefl_optimize_huffman_table(d,0,0x120,0xf,1);
    tdefl_optimize_huffman_table(d,1,0x20,0xf,1);
    uVar18 = d->m_bit_buffer | 1 << (d->m_bits_in & 0x1f);
    d->m_bit_buffer = uVar18;
    for (uVar11 = d->m_bits_in + 2; d->m_bits_in = uVar11, 7 < uVar11; uVar11 = uVar11 - 8) {
      pmVar34 = d->m_pOutput_buf;
      if (pmVar34 < d->m_pOutput_buf_end) {
        d->m_pOutput_buf = pmVar34 + 1;
        *pmVar34 = (mz_uint8)uVar18;
        uVar11 = d->m_bits_in;
        uVar18 = d->m_bit_buffer;
      }
      uVar18 = uVar18 >> 8;
      d->m_bit_buffer = uVar18;
    }
  }
  uVar27 = 1;
  pbVar6 = d->m_pLZ_code_buf;
  puVar23 = (ulong *)d->m_pOutput_buf;
  uVar30 = (ulong)uVar18;
  pmVar34 = d->m_lz_code_buf;
  while( true ) {
    if (pbVar6 <= pmVar34) {
      d->m_pOutput_buf = (mz_uint8 *)puVar23;
      mVar25 = 0;
      uVar21 = 0;
      for (; uVar11 != 0; uVar11 = uVar11 - (int)uVar27) {
        uVar27 = 0x10;
        if (uVar11 < 0x10) {
          uVar27 = (ulong)uVar11;
        }
        mVar25 = mVar25 | (mz_bitmasks[uVar27] & (uint)uVar30) << ((byte)uVar21 & 0x1f);
        d->m_bit_buffer = mVar25;
        for (uVar21 = uVar21 + (int)uVar27; d->m_bits_in = uVar21, 7 < uVar21; uVar21 = uVar21 - 8)
        {
          pmVar34 = d->m_pOutput_buf;
          if (pmVar34 < d->m_pOutput_buf_end) {
            d->m_pOutput_buf = pmVar34 + 1;
            *pmVar34 = (mz_uint8)mVar25;
            uVar21 = d->m_bits_in;
            mVar25 = d->m_bit_buffer;
          }
          mVar25 = mVar25 >> 8;
          d->m_bit_buffer = mVar25;
        }
        uVar30 = uVar30 >> ((byte)uVar27 & 0x3f);
      }
      bVar32 = d->m_huff_code_sizes[0][0x100];
      uVar11 = (uint)d->m_huff_codes[0][0x100] << ((byte)uVar21 & 0x1f) | mVar25;
      d->m_bit_buffer = uVar11;
      uVar21 = bVar32 + uVar21;
      while( true ) {
        d->m_bits_in = uVar21;
        pmVar34 = d->m_pOutput_buf;
        if (uVar21 < 8) break;
        if (pmVar34 < d->m_pOutput_buf_end) {
          d->m_pOutput_buf = pmVar34 + 1;
          *pmVar34 = (mz_uint8)uVar11;
          uVar21 = d->m_bits_in;
          uVar11 = d->m_bit_buffer;
        }
        uVar11 = uVar11 >> 8;
        d->m_bit_buffer = uVar11;
        uVar21 = uVar21 - 8;
      }
      return (uint)(pmVar34 < d->m_pOutput_buf_end);
    }
    pmVar33 = pmVar34;
    if ((int)uVar27 == 1) {
      pmVar33 = pmVar34 + 1;
      uVar27 = (ulong)(*pmVar34 | 0x100);
    }
    uVar19 = (uint)uVar27;
    uVar21 = uVar19;
    if ((uVar27 & 1) == 0) {
      pmVar34 = pmVar33 + 1;
      uVar30 = (ulong)d->m_huff_codes[0][*pmVar33] << ((byte)uVar11 & 0x3f) | uVar30;
      uVar11 = d->m_huff_code_sizes[0][*pmVar33] + uVar11;
      if (((uVar27 & 2) == 0) && (pmVar34 < pbVar6)) {
        uVar21 = (uint)(uVar27 >> 1);
        pmVar34 = pmVar33 + 2;
        uVar30 = uVar30 | (ulong)d->m_huff_codes[0][pmVar33[1]] << ((byte)uVar11 & 0x3f);
        uVar11 = uVar11 + d->m_huff_code_sizes[0][pmVar33[1]];
        if (((uVar27 & 4) == 0) && (pmVar34 < pbVar6)) {
          pmVar34 = pmVar33 + 3;
          uVar30 = uVar30 | (ulong)d->m_huff_codes[0][pmVar33[2]] << ((byte)uVar11 & 0x3f);
          uVar11 = uVar11 + d->m_huff_code_sizes[0][pmVar33[2]];
          uVar21 = uVar19 >> 2;
        }
      }
    }
    else {
      bVar32 = *pmVar33;
      iVar16 = d->m_huff_code_sizes[0][s_tdefl_len_sym[bVar32]] + uVar11;
      uVar5 = *(ushort *)(pmVar33 + 1);
      pmVar34 = pmVar33 + 3;
      iVar17 = iVar16 + (uint)""[bVar32];
      uVar19 = uVar5 & 0x1ff;
      pbVar15 = "" + (uVar5 >> 8);
      pbVar8 = "" + (uVar5 >> 8);
      if (uVar5 < 0x200) {
        pbVar15 = "" + uVar19;
        pbVar8 = "" + uVar19;
      }
      iVar20 = (uint)d->m_huff_code_sizes[1][*pbVar8] + iVar17;
      uVar30 = (ulong)(mz_bitmasks[""[bVar32]] & (uint)bVar32) << ((byte)iVar16 & 0x3f) |
               (ulong)d->m_huff_codes[0][s_tdefl_len_sym[bVar32]] << ((byte)uVar11 & 0x3f) |
               (ulong)d->m_huff_codes[1][*pbVar8] << ((byte)iVar17 & 0x3f) |
               (ulong)((uint)uVar5 & mz_bitmasks[*pbVar15]) << ((byte)iVar20 & 0x3f) | uVar30;
      uVar11 = iVar20 + (uint)*pbVar15;
    }
    if (d->m_pOutput_buf_end <= puVar23) break;
    *puVar23 = uVar30;
    puVar23 = (ulong *)((long)puVar23 + (ulong)(uVar11 >> 3));
    uVar30 = uVar30 >> ((byte)uVar11 & 0x38);
    uVar11 = uVar11 & 7;
    uVar27 = (ulong)(uVar21 >> 1);
  }
  return 0;
}

Assistant:

static mz_bool tdefl_compress_block(tdefl_compressor* d, mz_bool static_block) {
  if (static_block)
    tdefl_start_static_block(d);
  else
    tdefl_start_dynamic_block(d);
  return tdefl_compress_lz_codes(d);
}